

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# questpgr.c
# Opt level: O0

void load_qtlist(void)

{
  int iVar1;
  long local_c8;
  long qt_offsets [16];
  char qt_classes [16] [3];
  int local_10;
  int local_c;
  int i;
  int n_classes;
  
  msg_file = dlb_fopen("quest.dat","r");
  if (msg_file != (dlb *)0x0) {
    Fread(&local_c,4,1,msg_file);
    Fread(qt_offsets + 0xf,3,local_c,msg_file);
    Fread(&local_c8,8,local_c,msg_file);
    qt_list.chrole = (qtmsg *)0x0;
    qt_list.common = (qtmsg *)0x0;
    for (local_10 = 0; local_10 < local_c; local_10 = local_10 + 1) {
      iVar1 = strncmp("-",qt_classes[(long)local_10 + -3] + 1,3);
      if (iVar1 == 0) {
        qt_list.common = construct_qtlist(qt_offsets[(long)local_10 + -1]);
      }
      else {
        iVar1 = strncmp(urole.filecode,qt_classes[(long)local_10 + -3] + 1,3);
        if (iVar1 == 0) {
          qt_list.chrole = construct_qtlist(qt_offsets[(long)local_10 + -1]);
        }
      }
    }
    if ((qt_list.common == (qtmsg *)0x0) || (qt_list.chrole == (qtmsg *)0x0)) {
      impossible("load_qtlist: cannot load quest text.");
    }
    return;
  }
  panic("CANNOT OPEN QUEST TEXT FILE %s.","quest.dat");
}

Assistant:

void load_qtlist(void)
{
	int	n_classes, i;
	char	qt_classes[N_HDR][LEN_HDR];
	long	qt_offsets[N_HDR];

	msg_file = dlb_fopen(QTEXT_FILE, RDBMODE);
	if (!msg_file)
	    panic("CANNOT OPEN QUEST TEXT FILE %s.", QTEXT_FILE);

	/*
	 * Read in the number of classes, then the ID's & offsets for
	 * each header.
	 */
	Fread(&n_classes, sizeof(int), 1, msg_file);
	Fread(&qt_classes[0][0], sizeof(char)*LEN_HDR, n_classes, msg_file);
	Fread(qt_offsets, sizeof(long), n_classes, msg_file);

	/*
	 * Now construct the message lists for quick reference later
	 * on when we are actually paging the messages out.
	 */

	qt_list.common = qt_list.chrole = NULL;

	for (i = 0; i < n_classes; i++) {
	    if (!strncmp(COMMON_ID, qt_classes[i], LEN_HDR))
	    	qt_list.common = construct_qtlist(qt_offsets[i]);
	    else if (!strncmp(urole.filecode, qt_classes[i], LEN_HDR))
	    	qt_list.chrole = construct_qtlist(qt_offsets[i]);
	}

	if (!qt_list.common || !qt_list.chrole)
	    impossible("load_qtlist: cannot load quest text.");
	return;	/* no ***DON'T*** close the msg_file */
}